

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O3

PSocket * p_socket_new_from_fd(pint fd,PError **error)

{
  int iVar1;
  PSocketFamily PVar2;
  uint uVar3;
  pboolean pVar4;
  PSocket *mem;
  PSocketType PVar5;
  PError **extraout_RDX;
  PError **extraout_RDX_00;
  PError **ppPVar6;
  socklen_t optlen;
  socklen_t addrlen;
  pint value;
  PSocketFamily family;
  sockaddr_storage address;
  socklen_t local_ac;
  socklen_t local_a8;
  int local_a4;
  int local_a0;
  undefined1 local_9c [4];
  sockaddr local_98 [8];
  
  if (fd < 0) {
    p_socket_new_from_fd_cold_7();
    return (PSocket *)0x0;
  }
  mem = (PSocket *)p_malloc0(0x1c);
  if (mem == (PSocket *)0x0) {
    p_socket_new_from_fd_cold_6();
    return (PSocket *)0x0;
  }
  mem->fd = fd;
  local_ac = 4;
  iVar1 = getsockopt(fd,1,3,&local_a0,&local_ac);
  if (iVar1 != 0) {
    p_socket_new_from_fd_cold_1();
    goto LAB_001150d6;
  }
  if (local_ac != 4) {
    p_socket_new_from_fd_cold_2();
    goto LAB_001150d6;
  }
  PVar5 = P_SOCKET_TYPE_UNKNOWN;
  if (local_a0 - 1U < 5) {
    PVar5 = *(PSocketType *)(&DAT_0011840c + (ulong)(local_a0 - 1U) * 4);
  }
  mem->type = PVar5;
  local_a8 = 0x80;
  iVar1 = getsockname(fd,local_98,&local_a8);
  if (iVar1 != 0) {
    p_socket_new_from_fd_cold_3();
    goto LAB_001150d6;
  }
  if (local_a8 == 0) {
    local_ac = 4;
    iVar1 = getsockopt(mem->fd,1,0x27,local_9c,&local_ac);
    if (iVar1 != 0) {
      p_socket_new_from_fd_cold_4();
      goto LAB_001150d6;
    }
  }
  PVar2 = (PSocketFamily)local_98[0].sa_family;
  if (local_98[0].sa_family == 2) {
LAB_00114fd7:
    mem->family = PVar2;
    uVar3 = mem->type - P_SOCKET_TYPE_STREAM;
    if (uVar3 < 3) {
      mem->protocol = *(PSocketProtocol *)(&DAT_00118420 + (ulong)uVar3 * 4);
    }
    local_a8 = 0x80;
    iVar1 = getpeername(fd,local_98,&local_a8);
    if (-1 < iVar1) {
      mem->field_0x18 = mem->field_0x18 | 8;
    }
  }
  else {
    if (local_98[0].sa_family == 10) {
      PVar2 = P_SOCKET_FAMILY_INET6;
      goto LAB_00114fd7;
    }
    mem->family = P_SOCKET_FAMILY_UNKNOWN;
  }
  local_ac = 4;
  iVar1 = getsockopt(fd,1,9,&local_a4,&local_ac);
  ppPVar6 = extraout_RDX;
  if (iVar1 == 0) {
    if (local_ac != 4) {
      printf("** Warning: %s **\n",
             "PSocket::pp_socket_set_details_from_fd: getsockopt() with SO_KEEPALIVE failed");
      ppPVar6 = extraout_RDX_00;
    }
    mem->field_0x18 = mem->field_0x18 & 0xfd | (local_a4 != 0) * '\x02';
  }
  else {
    mem->field_0x18 = mem->field_0x18 & 0xfd;
  }
  pVar4 = pp_socket_set_fd_blocking(mem->fd,(pboolean)error,ppPVar6);
  if (pVar4 != 0) {
    p_socket_new_from_fd_cold_5();
    return mem;
  }
LAB_001150d6:
  p_free(mem);
  return (PSocket *)0x0;
}

Assistant:

P_LIB_API PSocket *
p_socket_new_from_fd (pint	fd,
		      PError	**error)
{
	PSocket	*ret;
#if !defined (P_OS_WIN) && defined (SO_NOSIGPIPE)
	pint	flags;
#endif

	if (P_UNLIKELY (fd < 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Unable to create socket from bad fd");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocket))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for socket");
		return NULL;
	}

	ret->fd = fd;

	if (P_UNLIKELY (pp_socket_set_details_from_fd (ret, error) == FALSE)) {
		p_free (ret);
		return NULL;
	}

	if (P_UNLIKELY (pp_socket_set_fd_blocking (ret->fd, FALSE, error) == FALSE)) {
		p_free (ret);
		return NULL;
	}

#if !defined (P_OS_WIN) && defined (SO_NOSIGPIPE)
	flags = 1;

	if (setsockopt (ret->fd, SOL_SOCKET, SO_NOSIGPIPE, &flags, sizeof (flags)) < 0)
		P_WARNING ("PSocket::p_socket_new_from_fd: setsockopt() with SO_NOSIGPIPE failed");
#endif

	p_socket_set_listen_backlog (ret, P_SOCKET_DEFAULT_BACKLOG);

	ret->timeout  = 0;
	ret->blocking = TRUE;

#ifdef P_OS_SCO
	if (P_UNLIKELY ((ret->timer = p_time_profiler_new ()) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for internal timer");
		p_free (ret);
		return NULL;
	}
#endif

#ifdef P_OS_WIN
	if (P_UNLIKELY ((ret->events = WSACreateEvent ()) == WSA_INVALID_EVENT)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     (pint) p_error_get_last_net (),
				     "Failed to call WSACreateEvent() on socket");
		p_free (ret);
		return NULL;
	}
#endif

	return ret;
}